

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::store
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this,ostream *_ostr,bool _swap)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  
  lVar3 = 0;
  sVar5 = 0;
  uVar4 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)this + 0x58))(this);
    if (uVar1 <= uVar4) break;
    sVar2 = IO::binary<OpenMesh::Attributes::StatusInfo>::store
                      (_ostr,(value_type *)
                             ((long)&((this->data_).
                                      super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->status_ + lVar3),
                       _swap);
    sVar5 = sVar5 + sVar2;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 4;
  }
  return sVar5;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }